

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

ALLEGRO_USTR * al_ustr_newf(char *fmt,...)

{
  char in_AL;
  _al_bstring us;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  us = _al_bfromcstr("");
  local_e8.gp_offset = 8;
  local_e8.fp_offset = 0x30;
  local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_e8.reg_save_area = local_c8;
  al_ustr_vappendf(us,fmt,&local_e8);
  return us;
}

Assistant:

ALLEGRO_USTR *al_ustr_newf(const char *fmt, ...)
{
   ALLEGRO_USTR *us;
   va_list ap;

   us = al_ustr_new("");
   va_start(ap, fmt);
   al_ustr_vappendf(us, fmt, ap);
   va_end(ap);
   return us;
}